

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<Fad<double>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSin<Fad<double>_>_>_>_> *pFVar5;
  FadExpr<FadFuncSin<Fad<double>_>_> *pFVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pFVar5 = this->left_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  dVar1 = (pFVar6->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar7 = cos((pFVar6->fadexpr_).expr_.val_);
  dVar2 = (pFVar5->fadexpr_).left_.constant_;
  dVar8 = sin((this->right_->fadexpr_).expr_.val_);
  dVar3 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar9 = cos((this->right_->fadexpr_).expr_.val_);
  dVar4 = (this->left_->fadexpr_).left_.constant_;
  dVar10 = sin((((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_);
  return dVar10 * dVar4 * dVar9 * dVar3 + dVar8 * dVar7 * dVar1 * dVar2;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}